

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O3

int zip_entry_fwrite(zip_t *zip,char *filename)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  size_t bufsize;
  uint uVar4;
  uint uVar5;
  stat file_stat;
  mz_uint8 buf [65536];
  stat sStack_100b8;
  undefined1 auStack_10028 [65544];
  
  if (zip == (zip_t *)0x0) {
    iVar3 = -1;
  }
  else {
    memset(auStack_10028,0,0x10000);
    memset(&sStack_100b8,0,0x90);
    iVar1 = stat(filename,&sStack_100b8);
    iVar3 = -3;
    if (iVar1 == 0) {
      uVar4 = sStack_100b8.st_mode & 0xf000;
      uVar5 = sStack_100b8.st_mode & 0xfff;
      if (uVar4 == 0x4000) {
        uVar5 = sStack_100b8.st_mode;
      }
      uVar2 = uVar5 | 0xffff8000;
      if (uVar4 != 0x8000) {
        uVar2 = uVar5;
      }
      uVar5 = uVar2 | 0xffffa000;
      if (uVar4 != 0xa000) {
        uVar5 = uVar2;
      }
      uVar2 = uVar5 | 0x6000;
      if (uVar4 != 0x6000) {
        uVar2 = uVar5;
      }
      uVar5 = uVar2 | 0x2000;
      if (uVar4 != 0x2000) {
        uVar5 = uVar2;
      }
      uVar2 = uVar5 | 0x1000;
      if (uVar4 != 0x1000) {
        uVar2 = uVar5;
      }
      uVar5 = uVar2 | 0xffffc000;
      if (uVar4 != 0xc000) {
        uVar5 = uVar2;
      }
      uVar2 = (sStack_100b8.st_mode >> 7 & 1 | uVar5 << 0x10) ^ 1;
      uVar5 = uVar2 + 0x10;
      if (uVar4 != 0x4000) {
        uVar5 = uVar2;
      }
      (zip->entry).external_attr = uVar5;
      (zip->entry).m_time = sStack_100b8.st_mtim.tv_sec;
      __stream = fopen(filename,"rb");
      if (__stream == (FILE *)0x0) {
        iVar3 = -0x10;
      }
      else {
        do {
          bufsize = fread(auStack_10028,1,0x10000,__stream);
          if (bufsize == 0) {
            iVar3 = 0;
            goto LAB_0010f451;
          }
          iVar3 = zip_entry_write(zip,auStack_10028,bufsize);
        } while (-1 < iVar3);
        iVar3 = -8;
LAB_0010f451:
        fclose(__stream);
      }
    }
  }
  return iVar3;
}

Assistant:

int zip_entry_fwrite(struct zip_t *zip, const char *filename) {
  int err = 0;
  size_t n = 0;
  MZ_FILE *stream = NULL;
  mz_uint8 buf[MZ_ZIP_MAX_IO_BUF_SIZE];
  struct MZ_FILE_STAT_STRUCT file_stat;
  mz_uint16 modes;

  if (!zip) {
    // zip_t handler is not initialized
    return ZIP_ENOINIT;
  }

  memset(buf, 0, MZ_ZIP_MAX_IO_BUF_SIZE);
  memset((void *)&file_stat, 0, sizeof(struct MZ_FILE_STAT_STRUCT));
  if (MZ_FILE_STAT(filename, &file_stat) != 0) {
    // problem getting information - check errno
    return ZIP_ENOENT;
  }

#if defined(_WIN32) || defined(__WIN32__) || defined(DJGPP)
  (void)modes; // unused
#else
  /* Initialize with permission bits--which are not implementation-optional */
  modes = file_stat.st_mode &
          (S_IRWXU | S_IRWXG | S_IRWXO | S_ISUID | S_ISGID | S_ISVTX);
  if (S_ISDIR(file_stat.st_mode))
    modes |= UNX_IFDIR;
  if (S_ISREG(file_stat.st_mode))
    modes |= UNX_IFREG;
  if (S_ISLNK(file_stat.st_mode))
    modes |= UNX_IFLNK;
  if (S_ISBLK(file_stat.st_mode))
    modes |= UNX_IFBLK;
  if (S_ISCHR(file_stat.st_mode))
    modes |= UNX_IFCHR;
  if (S_ISFIFO(file_stat.st_mode))
    modes |= UNX_IFIFO;
  if (S_ISSOCK(file_stat.st_mode))
    modes |= UNX_IFSOCK;
  zip->entry.external_attr = (modes << 16) | !(file_stat.st_mode & S_IWUSR);
  if ((file_stat.st_mode & S_IFMT) == S_IFDIR) {
    zip->entry.external_attr |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;
  }
#endif

  zip->entry.m_time = file_stat.st_mtime;

  if (!(stream = MZ_FOPEN(filename, "rb"))) {
    // Cannot open filename
    return ZIP_EOPNFILE;
  }

  while ((n = fread(buf, sizeof(mz_uint8), MZ_ZIP_MAX_IO_BUF_SIZE, stream)) >
         0) {
    if (zip_entry_write(zip, buf, n) < 0) {
      err = ZIP_EWRTENT;
      break;
    }
  }
  fclose(stream);

  return err;
}